

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O1

int ngp_read_xtension(fitsfile *ff,int parent_hn,int simple_mode)

{
  bool bVar1;
  NGP_TOKEN *pNVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  int r;
  char ngph_ctmp;
  NGP_HDU ngph;
  int j;
  int tmp0;
  int my_version;
  int my_hn;
  long lv;
  char incrementor_name [80];
  long ngph_size [999];
  int local_2014;
  char *local_2010;
  int local_2008;
  undefined1 local_2001;
  ulong local_2000;
  NGP_HDU local_1ff8;
  fitsfile *local_1fe8;
  int local_1fdc;
  ulong local_1fd8;
  int local_1fd0 [3];
  int local_1fc4;
  long local_1fc0;
  char local_1fb8 [80];
  long local_1f68 [999];
  
  local_1fb8[0] = '\0';
  local_1ff8.tok = (NGP_TOKEN *)0x0;
  local_1ff8.tokcnt = 0;
  local_2014 = 0;
  local_2014 = ngp_read_line(0);
  if (local_2014 == 0) {
    if ((simple_mode & 1U) == 0) {
      if (ngp_keyidx != 3) {
        return 0x171;
      }
    }
    else if (ngp_keyidx != 4) {
      return 0x171;
    }
    local_2014 = ngp_hdu_insert_token(&local_1ff8,&ngp_linkey);
    if (local_2014 == 0) {
      uVar7 = 0;
      local_2014 = 0;
      local_1fe8 = ff;
      local_1fdc = parent_hn;
      do {
        local_2014 = ngp_read_line(0);
        if (local_2014 != 0) {
          return local_2014;
        }
        bVar1 = true;
        if (ngp_keyidx - 1U < 3) {
          if (ngp_curline.line == (char *)0x0) {
            iVar4 = 0x16b;
          }
          else {
            iVar4 = 0x16c;
            if (ngp_prevline.line == (char *)0x0) {
              ngp_prevline.comment = ngp_curline.comment;
              ngp_prevline.format = ngp_curline.format;
              ngp_prevline.flags = ngp_curline.flags;
              ngp_prevline.value = ngp_curline.value;
              ngp_prevline.type = ngp_curline.type;
              ngp_prevline._28_4_ = ngp_curline._28_4_;
              ngp_prevline.line = ngp_curline.line;
              ngp_prevline.name = ngp_curline.name;
              ngp_curline.line = (char *)0x0;
              iVar4 = 0;
            }
          }
        }
        else {
          iVar4 = 0;
          if (ngp_keyidx != 5) {
            if (ngp_keyidx == 4) {
              local_2014 = 0x171;
              bVar1 = false;
              iVar4 = local_2014;
            }
            else {
              sVar5 = strlen(ngp_linkey.name);
              iVar4 = (int)sVar5;
              if (iVar4 - 2U < 5) {
                uVar8 = (ulong)(iVar4 - 1U);
                ff = local_1fe8;
                if (ngp_linkey.name[uVar8] == '#') {
                  if (local_1fb8[0] == '\0') {
                    memcpy(local_1fb8,ngp_linkey.name,uVar8);
                    local_1fb8[uVar8] = '\0';
                  }
                  sVar6 = strlen(local_1fb8);
                  if (iVar4 - 1U == (uint)sVar6) {
                    iVar3 = bcmp(local_1fb8,ngp_linkey.name,uVar8);
                    uVar7 = uVar7 + (iVar3 == 0);
                  }
                  ff = local_1fe8;
                  snprintf(ngp_linkey.name + ((sVar5 & 0xffffffff) - 1),(ulong)(0x4c - iVar4),"%d",
                           (ulong)uVar7);
                }
              }
              iVar4 = ngp_hdu_insert_token(&local_1ff8,&ngp_linkey);
              bVar1 = false;
              parent_hn = local_1fdc;
            }
          }
        }
        local_2014 = iVar4;
      } while ((!bVar1) && (local_2014 == 0));
      if (local_2014 == 0) {
        memset(local_1f68,0,0x1f38);
        if (local_1ff8.tokcnt < 1) {
          local_1fd8 = 0;
          local_2008 = 0;
          local_2000 = 0;
          local_2010 = (char *)0x0;
        }
        else {
          lVar10 = 0x50;
          lVar11 = 0;
          local_2010 = (char *)0x0;
          local_2000 = 0;
          local_2008 = 0;
          local_1fd8 = 0;
          do {
            pNVar2 = local_1ff8.tok;
            pcVar9 = (local_1ff8.tok)->name + lVar10 + -0x50;
            iVar4 = strcmp("XTENSION",pcVar9);
            if (iVar4 == 0) {
              if (*(int *)(pNVar2->name + lVar10 + -0x54) == 2) {
                iVar4 = fits_strncasecmp("BINTABLE",*(char **)(pNVar2->name + lVar10 + -4),8);
                uVar8 = local_2000 & 0xffffffff;
                if (iVar4 == 0) {
                  uVar8 = 3;
                }
                iVar4 = fits_strncasecmp("TABLE",*(char **)((local_1ff8.tok)->name + lVar10 + -4),5)
                ;
                if (iVar4 == 0) {
                  uVar8 = 2;
                }
                iVar4 = fits_strncasecmp("IMAGE",*(char **)((local_1ff8.tok)->name + lVar10 + -4),5)
                ;
                local_2000 = uVar8;
                if (iVar4 == 0) {
                  local_2000 = 1;
                }
              }
            }
            else {
              iVar4 = strcmp("SIMPLE",pcVar9);
              if (iVar4 == 0) {
                if ((*(int *)(pNVar2->name + lVar10 + -0x54) == 1) &&
                   (local_2000 = local_2000 & 0xffffffff, pNVar2->name[lVar10 + -4] != '\0')) {
                  local_2000 = 1;
                }
              }
              else {
                iVar4 = strcmp("BITPIX",pcVar9);
                if (iVar4 == 0) {
                  if (*(int *)(pNVar2->name + lVar10 + -0x54) == 3) {
                    local_2008 = *(int *)(pNVar2->name + lVar10 + -4);
                  }
                }
                else {
                  iVar4 = strcmp("NAXIS",pcVar9);
                  if (iVar4 == 0) {
                    if (*(int *)(pNVar2->name + lVar10 + -0x54) == 3) {
                      local_1fd8 = (ulong)*(uint *)(pNVar2->name + lVar10 + -4);
                    }
                  }
                  else {
                    iVar4 = strcmp("EXTNAME",pcVar9);
                    if (iVar4 == 0) {
                      if (*(int *)(pNVar2->name + lVar10 + -0x54) == 2) {
                        local_2010 = *(char **)(pNVar2->name + lVar10 + -4);
                      }
                    }
                    else {
                      iVar4 = __isoc99_sscanf(pcVar9,"NAXIS%d%c",local_1fd0,&local_2001);
                      if (((iVar4 == 1) && (*(int *)((local_1ff8.tok)->name + lVar10 + -0x54) == 3))
                         && (local_1fd0[0] - 1U < 999)) {
                        local_1f68[local_1fd0[0] - 1U] =
                             (long)*(int *)((local_1ff8.tok)->name + lVar10 + -4);
                      }
                    }
                  }
                }
              }
            }
            lVar11 = lVar11 + 1;
            lVar10 = lVar10 + 0xb0;
          } while (lVar11 < local_1ff8.tokcnt);
        }
        parent_hn = local_1fdc;
        ff = local_1fe8;
        iVar4 = (int)local_2000;
        if (iVar4 - 2U < 2) {
          ffcrtb(local_1fe8,(iVar4 != 2) + 1,0,0,(char **)0x0,(char **)0x0,(char **)0x0,(char *)0x0,
                 &local_2014);
          pcVar9 = local_2010;
          if (((local_2014 == 0) &&
              (local_2014 = ngp_append_columns(ff,&local_1ff8,0), pcVar9 = local_2010,
              local_2014 == 0)) &&
             (local_2014 = ngp_keyword_all_write(&local_1ff8,ff,0), pcVar9 = local_2010,
             0 < local_1f68[1] && local_2014 == 0)) {
            ffirow(ff,0,local_1f68[1],&local_2014);
            pcVar9 = local_2010;
          }
        }
        else if (iVar4 == 1) {
          if ((simple_mode & 3U) == 2) {
            ffcrim(local_1fe8,0x10,0,(long *)0x0,&local_2014);
          }
          ffcrim(ff,local_2008,(int)local_1fd8,local_1f68,&local_2014);
          pcVar9 = local_2010;
          if (local_2014 == 0) {
            local_2014 = ngp_keyword_all_write(&local_1ff8,ff,0);
            pcVar9 = local_2010;
          }
        }
        else {
          local_2014 = 0x170;
          pcVar9 = local_2010;
        }
      }
      else {
        pcVar9 = (char *)0x0;
      }
      if ((local_2014 == 0) && (pcVar9 != (char *)0x0)) {
        local_2014 = ngp_get_extver(pcVar9,local_1fd0 + 2);
        local_1fc0 = (long)local_1fd0[2];
        ffpky(ff,0x29,"EXTVER",&local_1fc0,"auto assigned by template parser",&local_2014);
      }
      if ((0 < parent_hn) && (local_2014 == 0)) {
        ffghdn(ff,&local_1fc4);
        ffmahd(ff,parent_hn,local_1fd0 + 1,&local_2014);
        ffgtam(ff,(fitsfile *)0x0,local_1fc4,&local_2014);
        ffmahd(ff,local_1fc4,local_1fd0 + 1,&local_2014);
        if (local_2014 != 0) {
          return local_2014;
        }
      }
      if (local_2014 != 0) {
        local_1fd0[1] = 0;
        ffdhdu(ff,(int *)0x0,local_1fd0 + 1);
      }
      ngp_hdu_clear(&local_1ff8);
    }
  }
  return local_2014;
}

Assistant:

int	ngp_read_xtension(fitsfile *ff, int parent_hn, int simple_mode)
 { int		r, exflg, l, my_hn, tmp0, incrementor_index, i, j;
   int		ngph_dim, ngph_bitpix, ngph_node_type, my_version;
   char		incrementor_name[NGP_MAX_STRING], ngph_ctmp;
   char 	*ngph_extname = 0;
   long		ngph_size[NGP_MAX_ARRAY_DIM];
   NGP_HDU	ngph;
   long		lv;

   incrementor_name[0] = 0;			/* signal no keyword+'#' found yet */
   incrementor_index = 0;

   if (NGP_OK != (r = ngp_hdu_init(&ngph))) return(r);

   if (NGP_OK != (r = ngp_read_line(0))) return(r);	/* EOF always means error here */
   switch (NGP_XTENSION_SIMPLE & simple_mode)
     {
       case 0:  if (NGP_TOKEN_XTENSION != ngp_keyidx) return(NGP_TOKEN_NOT_EXPECT);
		break;
       default:	if (NGP_TOKEN_SIMPLE != ngp_keyidx) return(NGP_TOKEN_NOT_EXPECT);
		break;
     }
       	
   if (NGP_OK != (r = ngp_hdu_insert_token(&ngph, &ngp_linkey))) return(r);

   for (;;)
    { if (NGP_OK != (r = ngp_read_line(0))) return(r);	/* EOF always means error here */
      exflg = 0;
      switch (ngp_keyidx)
       { 
	 case NGP_TOKEN_SIMPLE:
	 		r = NGP_TOKEN_NOT_EXPECT;
			break;
	 		                        
	 case NGP_TOKEN_END:
         case NGP_TOKEN_XTENSION:
         case NGP_TOKEN_GROUP:
         		r = ngp_unread_line();	/* WARNING - not break here .... */
         case NGP_TOKEN_EOF:
			exflg = 1;
 			break;

         default:	l = strlen(ngp_linkey.name);
			if ((l >= 2) && (l <= 6))
			  { if ('#' == ngp_linkey.name[l - 1])
			      { if (0 == incrementor_name[0])
			          { memcpy(incrementor_name, ngp_linkey.name, l - 1);
			            incrementor_name[l - 1] = 0;
			          }
			        if (((l - 1) == (int)strlen(incrementor_name)) && (0 == memcmp(incrementor_name, ngp_linkey.name, l - 1)))
			          { incrementor_index++;
			          }
			        snprintf(ngp_linkey.name + l - 1, NGP_MAX_NAME-l+1,"%d", incrementor_index);
			      }
			  }
			r = ngp_hdu_insert_token(&ngph, &ngp_linkey);
 			break;
       }
      if ((NGP_OK != r) || exflg) break;
    }

   if (NGP_OK == r)
     { 				/* we should scan keywords, and calculate HDU's */
				/* structure ourselves .... */

       ngph_node_type = NGP_NODE_INVALID;	/* init variables */
       ngph_bitpix = 0;
       ngph_extname = NULL;
       for (i=0; i<NGP_MAX_ARRAY_DIM; i++) ngph_size[i] = 0;
       ngph_dim = 0;

       for (i=0; i<ngph.tokcnt; i++)
        { if (!strcmp("XTENSION", ngph.tok[i].name))
            { if (NGP_TTYPE_STRING == ngph.tok[i].type)
                { if (!fits_strncasecmp("BINTABLE", ngph.tok[i].value.s,8)) ngph_node_type = NGP_NODE_BTABLE;
                  if (!fits_strncasecmp("TABLE", ngph.tok[i].value.s,5)) ngph_node_type = NGP_NODE_ATABLE;
                  if (!fits_strncasecmp("IMAGE", ngph.tok[i].value.s,5)) ngph_node_type = NGP_NODE_IMAGE;
                }
            }
          else if (!strcmp("SIMPLE", ngph.tok[i].name))
            { if (NGP_TTYPE_BOOL == ngph.tok[i].type)
                { if (ngph.tok[i].value.b) ngph_node_type = NGP_NODE_IMAGE;
                }
            }
          else if (!strcmp("BITPIX", ngph.tok[i].name))
            { if (NGP_TTYPE_INT == ngph.tok[i].type)  ngph_bitpix = ngph.tok[i].value.i;
            }
          else if (!strcmp("NAXIS", ngph.tok[i].name))
            { if (NGP_TTYPE_INT == ngph.tok[i].type)  ngph_dim = ngph.tok[i].value.i;
            }
          else if (!strcmp("EXTNAME", ngph.tok[i].name))	/* assign EXTNAME, I hope struct does not move */
            { if (NGP_TTYPE_STRING == ngph.tok[i].type)  ngph_extname = ngph.tok[i].value.s;
            }
          else if (1 == sscanf(ngph.tok[i].name, "NAXIS%d%c", &j, &ngph_ctmp))
            { if (NGP_TTYPE_INT == ngph.tok[i].type)
		if ((j>=1) && (j <= NGP_MAX_ARRAY_DIM))
		  { ngph_size[j - 1] = ngph.tok[i].value.i;
		  }
            }
        }

       switch (ngph_node_type)
        { case NGP_NODE_IMAGE:
			if (NGP_XTENSION_FIRST == ((NGP_XTENSION_FIRST | NGP_XTENSION_SIMPLE) & simple_mode))
			  { 		/* if caller signals that this is 1st HDU in file */
					/* and it is IMAGE defined with XTENSION, then we */
					/* need create dummy Primary HDU */			  
			    fits_create_img(ff, 16, 0, NULL, &r);
			  }
					/* create image */
			fits_create_img(ff, ngph_bitpix, ngph_dim, ngph_size, &r);

					/* update keywords */
			if (NGP_OK == r)  r = ngp_keyword_all_write(&ngph, ff, NGP_NON_SYSTEM_ONLY);
			break;

          case NGP_NODE_ATABLE:
          case NGP_NODE_BTABLE:
					/* create table, 0 rows and 0 columns for the moment */
			fits_create_tbl(ff, ((NGP_NODE_ATABLE == ngph_node_type)
					     ? ASCII_TBL : BINARY_TBL),
					0, 0, NULL, NULL, NULL, NULL, &r);
			if (NGP_OK != r) break;

					/* add columns ... */
			r = ngp_append_columns(ff, &ngph, 0);
			if (NGP_OK != r) break;

					/* add remaining keywords */
			r = ngp_keyword_all_write(&ngph, ff, NGP_NON_SYSTEM_ONLY);
			if (NGP_OK != r) break;

					/* if requested add rows */
			if (ngph_size[1] > 0) fits_insert_rows(ff, 0, ngph_size[1], &r);
			break;

	  default:	r = NGP_BAD_ARG;
	  		break;
	}

     }

   if ((NGP_OK == r) && (NULL != ngph_extname))
     { r = ngp_get_extver(ngph_extname, &my_version);	/* write correct ext version number */
       lv = my_version;		/* bugfix - 22-Jan-99, BO - nonalignment of OSF/Alpha */
       fits_write_key(ff, TLONG, "EXTVER", &lv, "auto assigned by template parser", &r); 
     }

   if (NGP_OK == r)
     { if (parent_hn > 0)
         { fits_get_hdu_num(ff, &my_hn);
           fits_movabs_hdu(ff, parent_hn, &tmp0, &r);	/* link us to parent */
           fits_add_group_member(ff, NULL, my_hn, &r);
           fits_movabs_hdu(ff, my_hn, &tmp0, &r);
           if (NGP_OK != r) return(r);
         }
     }

   if (NGP_OK != r)					/* in case of error - delete hdu */
     { tmp0 = 0;
       fits_delete_hdu(ff, NULL, &tmp0);
     }

   ngp_hdu_clear(&ngph);
   return(r);
 }